

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_stadium
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::sse2>_> *position)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined4 extraout_EAX;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  batch bVar33;
  batch bVar34;
  batch bVar35;
  float local_58;
  float fStack_54;
  
  fVar28 = ctx->flippedBasis[0];
  fVar3 = ctx->flippedBasis[1];
  fVar4 = ctx->flippedBasis[2];
  fVar5 = ctx->flippedBasis[3];
  fVar6 = (position->x).super_simd_register<float,_xsimd::sse2>.data[0];
  fVar7 = (position->x).super_simd_register<float,_xsimd::sse2>.data[1];
  fVar27 = (position->x).super_simd_register<float,_xsimd::sse2>.data[2];
  fVar8 = (position->x).super_simd_register<float,_xsimd::sse2>.data[3];
  fVar9 = (position->y).super_simd_register<float,_xsimd::sse2>.data[0];
  fVar10 = (position->y).super_simd_register<float,_xsimd::sse2>.data[1];
  fVar11 = (position->y).super_simd_register<float,_xsimd::sse2>.data[2];
  fVar12 = (position->y).super_simd_register<float,_xsimd::sse2>.data[3];
  fVar13 = (position->z).super_simd_register<float,_xsimd::sse2>.data[0];
  fVar14 = (position->z).super_simd_register<float,_xsimd::sse2>.data[1];
  fVar15 = (position->z).super_simd_register<float,_xsimd::sse2>.data[2];
  fVar16 = (position->z).super_simd_register<float,_xsimd::sse2>.data[3];
  fVar17 = ctx->flippedBasis[4];
  fVar18 = ctx->flippedBasis[5];
  fVar29 = fVar5 * fVar6 + fVar17 * fVar9 + fVar18 * fVar13;
  fVar30 = fVar5 * fVar7 + fVar17 * fVar10 + fVar18 * fVar14;
  fVar31 = (float)((uint)(fVar28 * fVar6 + fVar3 * fVar9 + fVar4 * fVar13) & (uint)DAT_001cca10);
  fVar32 = (float)((uint)(fVar28 * fVar7 + fVar3 * fVar10 + fVar4 * fVar14) & DAT_001cca10._4_4_);
  fVar19 = ctx->circle_test[0];
  fVar20 = ctx->circle_test[1];
  fVar25 = fVar19 * fVar31 + fVar20 * fVar29;
  fVar26 = fVar19 * fVar32 + fVar20 * fVar30;
  fVar27 = fVar19 * (float)((uint)(fVar28 * fVar27 + fVar3 * fVar11 + fVar4 * fVar15) &
                           DAT_001cca10._8_4_) +
           fVar20 * (fVar5 * fVar27 + fVar17 * fVar11 + fVar18 * fVar15);
  fVar28 = fVar19 * (float)((uint)(fVar28 * fVar8 + fVar3 * fVar12 + fVar4 * fVar16) &
                           DAT_001cca10._12_4_) +
           fVar20 * (fVar5 * fVar8 + fVar17 * fVar12 + fVar18 * fVar16);
  bVar33.super_simd_register<float,_xsimd::sse2>.data[0] =
       (uint)(ctx->flippedBasis[6] * fVar6 +
             ctx->flippedBasis[7] * fVar9 + ctx->flippedBasis[8] * fVar13) & (uint)DAT_001cca10;
  bVar33.super_simd_register<float,_xsimd::sse2>.data[1] =
       (uint)(ctx->flippedBasis[6] * fVar7 +
             ctx->flippedBasis[7] * fVar10 + ctx->flippedBasis[8] * fVar14) & DAT_001cca10._4_4_;
  bVar33.super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)(long)DAT_001cca10;
  bVar33.super_simd_register<float,_xsimd::sse2>.data[3] =
       (float)(int)((ulong)(long)DAT_001cca10 >> 0x20);
  bVar33 = weight_from_sin(this,ctx,bVar33);
  uVar24 = bVar33.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  bVar34.super_simd_register<float,_xsimd::sse2>.data[2] = ctx->right_circle_centre[1] * fVar29;
  bVar34.super_simd_register<float,_xsimd::sse2>.data[3] = ctx->right_circle_centre[1] * fVar30;
  bVar34.super_simd_register<float,_xsimd::sse2>.data[0] =
       ctx->right_circle_centre[0] * fVar31 + bVar34.super_simd_register<float,_xsimd::sse2>.data[2]
  ;
  bVar34.super_simd_register<float,_xsimd::sse2>.data[1] =
       ctx->right_circle_centre[0] * fVar32 + bVar34.super_simd_register<float,_xsimd::sse2>.data[3]
  ;
  bVar34 = weight_from_cos(this,ctx,bVar34);
  uVar22 = -(uint)(fVar25 < 0.0);
  uVar23 = -(uint)(fVar26 < 0.0);
  auVar1._4_4_ = uVar23;
  auVar1._0_4_ = uVar22;
  auVar1._8_4_ = -(uint)(fVar27 < 0.0);
  auVar1._12_4_ = -(uint)(fVar28 < 0.0);
  iVar21 = movmskps(extraout_EAX,auVar1);
  if (iVar21 != 0) {
    uVar22 = -(uint)(0.0 <= fVar25);
    uVar23 = -(uint)(0.0 <= fVar26);
    auVar2._4_4_ = uVar23;
    auVar2._0_4_ = uVar22;
    auVar2._8_4_ = -(uint)(0.0 <= fVar27);
    auVar2._12_4_ = -(uint)(0.0 <= fVar28);
    iVar21 = movmskps(iVar21,auVar2);
    if (iVar21 == 0) {
      uVar24 = bVar34.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    }
    else {
      local_58 = bVar33.super_simd_register<float,_xsimd::sse2>.data[0];
      fStack_54 = bVar33.super_simd_register<float,_xsimd::sse2>.data[1];
      uVar22 = ~-(uint)(0.0 <= fVar25) &
               (uint)bVar34.super_simd_register<float,_xsimd::sse2>.data[0];
      uVar23 = ~-(uint)(0.0 <= fVar26) &
               (uint)bVar34.super_simd_register<float,_xsimd::sse2>.data[1];
      uVar24 = CONCAT44((uint)fStack_54 & -(uint)(0.0 <= fVar26),
                        (uint)local_58 & -(uint)(0.0 <= fVar25)) | CONCAT44(uVar23,uVar22);
    }
  }
  bVar35.super_simd_register<float,_xsimd::sse2>.data[3] = (float)uVar23;
  bVar35.super_simd_register<float,_xsimd::sse2>.data[2] = (float)uVar22;
  bVar35.super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar24;
  bVar35.super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)(uVar24 >> 0x20);
  return (batch)bVar35.super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }